

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::info(string *message)

{
  ostream *poVar1;
  string *in_RDI;
  
  if (0 < options::verbosity) {
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,in_RDI);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void info(std::string message) {
  if (options::verbosity > 0) {
    std::cout << options::printPrefix << message << std::endl;
  }
}